

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.cpp
# Opt level: O3

int ShouldCompress(BrotliTwoPassArena *s,uint8_t *input,size_t input_size,size_t num_literals)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double local_58;
  
  auVar7._8_4_ = (int)(input_size >> 0x20);
  auVar7._0_8_ = input_size;
  auVar7._12_4_ = 0x45300000;
  dVar11 = (auVar7._8_8_ - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)input_size) - 4503599627370496.0);
  auVar8._8_4_ = (int)(num_literals >> 0x20);
  auVar8._0_8_ = num_literals;
  auVar8._12_4_ = 0x45300000;
  uVar1 = 1;
  if (dVar11 * 0.98 <=
      (auVar8._8_8_ - 1.9342813113834067e+25) +
      ((double)CONCAT44(0x43300000,(int)num_literals) - 4503599627370496.0)) {
    memset(s,0,0x400);
    if (input_size != 0) {
      uVar2 = 0;
      do {
        s->lit_histo[input[uVar2]] = s->lit_histo[input[uVar2]] + 1;
        uVar2 = uVar2 + 0x2b;
      } while (uVar2 < input_size);
    }
    dVar10 = 0.0;
    uVar2 = 0xfffffffffffffff8;
    uVar5 = 0;
    do {
      uVar1 = *(uint *)((long)s->lit_histo + uVar2 + 8);
      uVar4 = (ulong)uVar1;
      if (uVar4 < 0x100) {
        dVar12 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar4];
        local_58 = (double)(int)uVar1;
      }
      else {
        local_58 = (double)uVar4;
        dVar12 = log2(local_58);
      }
      uVar3 = (ulong)*(uint *)((long)s->lit_histo + uVar2 + 0xc);
      if (uVar3 < 0x100) {
        dVar6 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar3];
      }
      else {
        dVar6 = log2((double)uVar3);
      }
      uVar5 = uVar5 + uVar4 + uVar3;
      dVar10 = (dVar10 - local_58 * dVar12) - (double)uVar3 * dVar6;
      uVar2 = uVar2 + 8;
    } while (uVar2 < 0x3f8);
    auVar9._8_4_ = (int)(uVar5 >> 0x20);
    auVar9._0_8_ = uVar5;
    auVar9._12_4_ = 0x45300000;
    dVar12 = (auVar9._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)uVar5) - 4503599627370496.0);
    if (uVar5 != 0) {
      if (uVar5 < 0x100) {
        dVar6 = (double)(&duckdb_brotli::kBrotliLog2Table)[uVar5];
      }
      else {
        dVar6 = log2(dVar12);
      }
      dVar10 = dVar10 + dVar6 * dVar12;
    }
    if (dVar12 <= dVar10) {
      dVar12 = dVar10;
    }
    uVar1 = (uint)(dVar12 < (dVar11 * 8.0 * 0.98) / 43.0);
  }
  return uVar1;
}

Assistant:

static BROTLI_BOOL ShouldCompress(BrotliTwoPassArena* s,
    const uint8_t* input, size_t input_size, size_t num_literals) {
  double corpus_size = (double)input_size;
  if ((double)num_literals < MIN_RATIO * corpus_size) {
    return BROTLI_TRUE;
  } else {
    const double max_total_bit_cost = corpus_size * 8 * MIN_RATIO / SAMPLE_RATE;
    size_t i;
    memset(s->lit_histo, 0, sizeof(s->lit_histo));
    for (i = 0; i < input_size; i += SAMPLE_RATE) {
      ++s->lit_histo[input[i]];
    }
    return TO_BROTLI_BOOL(BitsEntropy(s->lit_histo, 256) < max_total_bit_cost);
  }
}